

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::CRotationY<std::complex<double>_>::equals
          (CRotationY<std::complex<double>_> *this,QObject<std::complex<double>_> *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  rotation_type *this_00;
  rotation_type *other_00;
  bool local_59;
  CRotationY<std::complex<double>_> *local_40;
  CRY *p;
  QObject<std::complex<double>_> *other_local;
  CRotationY<std::complex<double>_> *this_local;
  
  if (other == (QObject<std::complex<double>_> *)0x0) {
    local_40 = (CRotationY<std::complex<double>_> *)0x0;
  }
  else {
    local_40 = (CRotationY<std::complex<double>_> *)
               __dynamic_cast(other,&QObject<std::complex<double>>::typeinfo,
                              &CRotationY<std::complex<double>>::typeinfo,0);
  }
  if (local_40 == (CRotationY<std::complex<double>_> *)0x0) {
    return false;
  }
  this_00 = rotation(local_40);
  other_00 = rotation(this);
  bVar1 = QRotation<double>::operator!=(this_00,other_00);
  if (bVar1) {
    return false;
  }
  iVar2 = QControlledGate2<std::complex<double>_>::controlState
                    (&local_40->super_QControlledGate2<std::complex<double>_>);
  iVar3 = QControlledGate2<std::complex<double>_>::controlState
                    (&this->super_QControlledGate2<std::complex<double>_>);
  if (iVar2 == iVar3) {
    iVar2 = QControlledGate2<std::complex<double>_>::control
                      (&local_40->super_QControlledGate2<std::complex<double>_>);
    iVar3 = (*(local_40->super_QControlledGate2<std::complex<double>_>).
              super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
              [0xf])();
    if (iVar2 < iVar3) {
      iVar2 = QControlledGate2<std::complex<double>_>::control
                        (&this->super_QControlledGate2<std::complex<double>_>);
      iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
                super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                _vptr_QObject[0xf])();
      if (iVar2 < iVar3) {
        return true;
      }
    }
    iVar2 = QControlledGate2<std::complex<double>_>::control
                      (&local_40->super_QControlledGate2<std::complex<double>_>);
    iVar3 = (*(local_40->super_QControlledGate2<std::complex<double>_>).
              super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
              [0xf])();
    local_59 = false;
    if (iVar3 < iVar2) {
      iVar2 = QControlledGate2<std::complex<double>_>::control
                        (&this->super_QControlledGate2<std::complex<double>_>);
      iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
                super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                _vptr_QObject[0xf])();
      local_59 = iVar3 < iVar2;
    }
    return local_59;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CRY = CRotationY< T > ;
          if ( const CRY* p = dynamic_cast< const CRY* >( &other ) ) {
            if ( p->rotation() != this->rotation() ) return false ;
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }